

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_interface_block(CompilerGLSL *this,SPIRVariable *var)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var;
  ulong uVar7;
  SPIRType *pSVar8;
  SPIREntryPoint *pSVar9;
  uint *puVar10;
  bool *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  TypedID<(spirv_cross::Types)0> *in_R9;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  bool local_471;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_470;
  byte local_44a;
  string local_430 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  uint32_t local_3ac;
  undefined1 local_3a8 [8];
  SPIRType newtype;
  spirv_cross local_238 [32];
  string local_218;
  allocator local_1f1;
  string local_1f0 [32];
  TypedID *local_1d0;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  undefined1 local_1a8 [4];
  uint32_t i;
  uint32_t local_188;
  uint32_t local_184;
  char *local_180;
  char *block_qualifier;
  undefined1 local_170;
  string local_168;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_148;
  undefined1 local_140;
  uint local_134;
  string local_130 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_110;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_108;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *block_namespace;
  string block_name;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  char *local_60;
  char *qual;
  bool block;
  allocator local_41;
  string local_40;
  SPIRType *local_20;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  local_20 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
  if ((((type->basetype == Void) && (local_20->basetype == Double)) &&
      (((this->options).es & 1U) == 0)) && ((this->options).version < 0x19a)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_40,"GL_ARB_vertex_attrib_64bit",&local_41);
    require_extension_internal(this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  pmVar6 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(local_20->super_IVariant).self);
  qual._3_1_ = Bitset::get(&(pmVar6->decoration).decoration_flags,2);
  iVar5 = (*(this->super_Compiler)._vptr_Compiler[0x33])(this,type);
  local_60 = (char *)CONCAT44(extraout_var,iVar5);
  if ((qual._3_1_ & 1) == 0) {
    if ((local_20->basetype == Struct) &&
       (((((this->options).force_flattened_io_blocks & 1U) != 0 ||
         ((((this->options).es & 1U) != 0 && ((this->options).version < 0x136)))) ||
        ((((this->options).es & 1U) == 0 && ((this->options).version < 0x96)))))) {
      emit_flattened_io_block(this,(SPIRVariable *)type,local_60);
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      add_resource_name(this,uVar4);
      SPIRType::SPIRType((SPIRType *)local_3a8,local_20);
      bVar2 = is_legacy(this);
      if (((bVar2) && (type->basetype == Void)) && (local_20->basetype == Int)) {
        newtype.super_IVariant.self.id = 0xd;
      }
      if ((local_20->storage == Input) &&
         (bVar2 = VectorView<unsigned_int>::empty(&(local_20->array).super_VectorView<unsigned_int>)
         , !bVar2)) {
        local_3ac = (type->super_IVariant).self.id;
        bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)local_3ac,DecorationPatch);
        if ((!bVar2) &&
           ((pSVar9 = Compiler::get_entry_point(&this->super_Compiler),
            pSVar9->model == ExecutionModelTessellationControl ||
            (pSVar9 = Compiler::get_entry_point(&this->super_Compiler),
            pSVar9->model == ExecutionModelTessellationEvaluation)))) {
          puVar10 = VectorView<unsigned_int>::back((VectorView<unsigned_int> *)&newtype.vecsize);
          *puVar10 = 0;
          pbVar11 = VectorView<bool>::back
                              ((VectorView<bool> *)(newtype.array.stack_storage.aligned_char + 0x18)
                              );
          *pbVar11 = true;
        }
      }
      layout_for_variable_abi_cxx11_(&local_3d0,this,(SPIRVariable *)type);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[0x32])(&local_3f0,this,(ulong)uVar4);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_430,this,(ulong)uVar4,1);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])
                (&local_410,this,local_3a8,local_430,(ulong)uVar4);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (this,&local_3d0,&local_3f0,&local_410,(char (*) [2])0x6815db);
      ::std::__cxx11::string::~string((string *)&local_410);
      ::std::__cxx11::string::~string(local_430);
      ::std::__cxx11::string::~string((string *)&local_3f0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      SPIRType::~SPIRType((SPIRType *)local_3a8);
    }
  }
  else if (((((this->options).force_flattened_io_blocks & 1U) == 0) &&
           ((((this->options).es & 1U) == 0 || (0x135 < (this->options).version)))) &&
          ((((this->options).es & 1U) != 0 || (0x95 < (this->options).version)))) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      local_aa = 0;
      local_ab = 0;
      ::std::__cxx11::string::string((string *)&local_80,"GL_EXT_geometry_shader",&local_81);
      bVar2 = has_extension(this,&local_80);
      local_44a = 0;
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        local_aa = 1;
        ::std::__cxx11::string::string((string *)&local_a8,"GL_EXT_tessellation_shader",&local_a9);
        local_ab = 1;
        bVar2 = has_extension(this,&local_a8);
        local_44a = bVar2 ^ 0xff;
      }
      if ((local_ab & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_a8);
      }
      if ((local_aa & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
      if ((local_44a & 1) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_d0,"GL_EXT_shader_io_blocks",
                   (allocator *)(block_name.field_2._M_local_buf + 0xf));
        require_extension_internal(this,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(block_name.field_2._M_local_buf + 0xf));
      }
    }
    fixup_io_block_patch_primitive_qualifiers(this,(SPIRVariable *)type);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_20->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(&block_namespace,this,(ulong)uVar4,0);
    if (local_20->storage == Input) {
      local_470 = &this->block_input_names;
    }
    else {
      local_470 = &this->block_output_names;
    }
    local_100 = local_470;
    bVar3 = ::std::__cxx11::string::empty();
    local_471 = true;
    if ((bVar3 & 1) == 0) {
      local_108._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(local_100,(key_type *)&block_namespace);
      local_110._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     (local_100);
      local_471 = ::std::__detail::operator!=(&local_108,&local_110);
    }
    if (local_471 == false) {
      pVar12 = ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(local_100,(value_type *)&block_namespace);
      local_148._M_cur =
           (__node_type *)
           pVar12.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_140 = pVar12.second;
    }
    else {
      local_134 = (local_20->super_IVariant).self.id;
      (*(this->super_Compiler)._vptr_Compiler[3])(local_130,this,(ulong)local_134);
      ::std::__cxx11::string::operator=((string *)&block_namespace,local_130);
      ::std::__cxx11::string::~string(local_130);
    }
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      pSVar8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                (&local_168,(spirv_cross *)0x66305e,(char (*) [2])&(pSVar8->super_IVariant).self,
                 (TypedID<(spirv_cross::Types)0> *)0x66305e,
                 (char (*) [2])&(type->super_IVariant).self,in_R9);
      ::std::__cxx11::string::operator=((string *)&block_namespace,(string *)&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
    }
    pVar12 = ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&this->resource_names,(value_type *)&block_namespace);
    block_qualifier =
         (char *)pVar12.first.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur;
    local_170 = pVar12.second;
    local_184 = (type->super_IVariant).self.id;
    bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)local_184,DecorationPatch);
    if (bVar2) {
      local_180 = "patch ";
    }
    else {
      local_188 = (type->super_IVariant).self.id;
      bVar2 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)local_188,DecorationPerPrimitiveEXT);
      if (bVar2) {
        local_180 = "perprimitiveEXT ";
      }
      else {
        local_180 = "";
      }
    }
    layout_for_variable_abi_cxx11_((string *)local_1a8,this,(SPIRVariable *)type);
    statement<std::__cxx11::string,char_const*&,char_const*&,std::__cxx11::string&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               &local_180,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_namespace
              );
    ::std::__cxx11::string::~string((string *)local_1a8);
    begin_scope(this);
    ::std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&local_20->member_name_cache);
    __range3._4_4_ = 0;
    __begin3 = (TypedID<(spirv_cross::Types)1> *)&local_20->member_types;
    __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
    member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
    for (; __end3 != member; __end3 = __end3 + 1) {
      local_1d0 = (TypedID *)__end3;
      add_member_name(this,local_20,__range3._4_4_);
      pSVar8 = local_20;
      uVar4 = TypedID::operator_cast_to_unsigned_int(local_1d0);
      uVar1 = __range3._4_4_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f0,"",&local_1f1);
      (*(this->super_Compiler)._vptr_Compiler[0x15])
                (this,pSVar8,(ulong)uVar4,(ulong)uVar1,local_1f0,0);
      ::std::__cxx11::string::~string(local_1f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      __range3._4_4_ = __range3._4_4_ + 1;
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    add_resource_name(this,uVar4);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_238,this,(ulong)uVar4,1);
    pSVar8 = local_20;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar4;
    (*(this->super_Compiler)._vptr_Compiler[0x26])
              (&newtype.member_name_cache._M_h._M_single_bucket,this,pSVar8);
    join<std::__cxx11::string,std::__cxx11::string>
              (&local_218,local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &newtype.member_name_cache._M_h._M_single_bucket,ts_1);
    end_scope_decl(this,&local_218);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::~string((string *)&newtype.member_name_cache._M_h._M_single_bucket);
    ::std::__cxx11::string::~string((string *)local_238);
    statement<char_const(&)[1]>(this,(char (*) [1])0x65adc5);
    ::std::__cxx11::string::~string((string *)&block_namespace);
  }
  else {
    emit_flattened_io_block(this,(SPIRVariable *)type,local_60);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_interface_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	if (var.storage == StorageClassInput && type.basetype == SPIRType::Double &&
	    !options.es && options.version < 410)
	{
		require_extension_internal("GL_ARB_vertex_attrib_64bit");
	}

	// Either make it plain in/out or in/out blocks depending on what shader is doing ...
	bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);
	const char *qual = to_storage_qualifiers_glsl(var);

	if (block)
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		    (!options.es && options.version < 150))
		{
			// I/O blocks on ES require version 310 with Android Extension Pack extensions, or core version 320.
			// On desktop, I/O blocks were introduced with geometry shaders in GL 3.2 (GLSL 150).
			emit_flattened_io_block(var, qual);
		}
		else
		{
			if (options.es && options.version < 320)
			{
				// Geometry and tessellation extensions imply this extension.
				if (!has_extension("GL_EXT_geometry_shader") && !has_extension("GL_EXT_tessellation_shader"))
					require_extension_internal("GL_EXT_shader_io_blocks");
			}

			// Workaround to make sure we can emit "patch in/out" correctly.
			fixup_io_block_patch_primitive_qualifiers(var);

			// Block names should never alias.
			auto block_name = to_name(type.self, false);

			// The namespace for I/O blocks is separate from other variables in GLSL.
			auto &block_namespace = type.storage == StorageClassInput ? block_input_names : block_output_names;

			// Shaders never use the block by interface name, so we don't
			// have to track this other than updating name caches.
			if (block_name.empty() || block_namespace.find(block_name) != end(block_namespace))
				block_name = get_fallback_name(type.self);
			else
				block_namespace.insert(block_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (block_name.empty())
				block_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			// Instance names cannot alias block names.
			resource_names.insert(block_name);

			const char *block_qualifier;
			if (has_decoration(var.self, DecorationPatch))
				block_qualifier = "patch ";
			else if (has_decoration(var.self, DecorationPerPrimitiveEXT))
				block_qualifier = "perprimitiveEXT ";
			else
				block_qualifier = "";

			statement(layout_for_variable(var), block_qualifier, qual, block_name);
			begin_scope();

			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}

			add_resource_name(var.self);
			end_scope_decl(join(to_name(var.self), type_to_array_glsl(type, var.self)));
			statement("");
		}
	}
	else
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (type.basetype == SPIRType::Struct &&
		    (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		     (!options.es && options.version < 150)))
		{
			emit_flattened_io_block(var, qual);
		}
		else
		{
			add_resource_name(var.self);

			// Legacy GLSL did not support int attributes, we automatically
			// declare them as float and cast them on load/store
			SPIRType newtype = type;
			if (is_legacy() && var.storage == StorageClassInput && type.basetype == SPIRType::Int)
				newtype.basetype = SPIRType::Float;

			// Tessellation control and evaluation shaders must have either
			// gl_MaxPatchVertices or unsized arrays for input arrays.
			// Opt for unsized as it's the more "correct" variant to use.
			if (type.storage == StorageClassInput && !type.array.empty() &&
			    !has_decoration(var.self, DecorationPatch) &&
			    (get_entry_point().model == ExecutionModelTessellationControl ||
			     get_entry_point().model == ExecutionModelTessellationEvaluation))
			{
				newtype.array.back() = 0;
				newtype.array_size_literal.back() = true;
			}

			statement(layout_for_variable(var), to_qualifiers_glsl(var.self),
			          variable_decl(newtype, to_name(var.self), var.self), ";");
		}
	}
}